

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuAstcUtil.cpp
# Opt level: O2

int tcu::astc::anon_unknown_0::computeNumBitsForColorEndpoints(NormalBlockParams *params)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  
  bVar1 = params->isDualPlane;
  iVar2 = computeNumRequiredBits
                    (&params->weightISEParams,
                     params->weightGridHeight * params->weightGridWidth << (bVar1 & 0x1fU));
  if (params->numPartitions == 1) {
    iVar3 = -0x11;
  }
  else if (params->isMultiPartSingleCemMode == false) {
    iVar3 = params->numPartitions * -3 + -0x19;
  }
  else {
    iVar3 = -0x1d;
  }
  return ((uint)(bVar1 ^ 1) * 2 - iVar2) + iVar3 + 0x7e;
}

Assistant:

static inline int computeNumBitsForColorEndpoints (const NormalBlockParams& params)
{
	const int numWeightBits			= computeNumRequiredBits(params.weightISEParams, computeNumWeights(params));
	const int numConfigDataBits		= (params.numPartitions == 1 ? 17 : params.isMultiPartSingleCemMode ? 29 : 25 + 3*params.numPartitions) +
									  (params.isDualPlane ? 2 : 0);

	return 128 - numWeightBits - numConfigDataBits;
}